

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O1

double bsp_time(void)

{
  Spmd *pSVar1;
  timespec now;
  timespec local_20;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_time: can only be called within SPMD section\n");
  }
  pSVar1 = s_spmd;
  clock_gettime(1,&local_20);
  return (double)(local_20.tv_nsec - (pSVar1->m_time).tv_nsec) * 1e-09 +
         (double)(local_20.tv_sec - (pSVar1->m_time).tv_sec);
}

Assistant:

double bsp_time()
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_time: can only be called within SPMD section\n");

    return s_spmd->time();
}